

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_bind.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  app aVar1;
  element_type *peVar2;
  pointer piVar3;
  long lVar4;
  app object;
  i injector;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_i2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *in_stack_ffffffffffffff48;
  arg *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  arg *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *in_stack_ffffffffffffff70;
  long local_88;
  char *local_60;
  unique_ptr<i2,_std::default_delete<i2>_> *local_58;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_impl2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_2,_double>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_3,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>_>
  *local_50;
  undefined1 local_38 [56];
  
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                *)&boost::ext::di::v1_3_0::bind<i1>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<impl1,_0,_0>((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                     *)in_stack_ffffffffffffff48);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_i2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_i2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                *)&boost::ext::di::v1_3_0::bind<i2>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_i2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<impl2,_0,_0>(in_stack_ffffffffffffff48);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                *)&_ZN5boost3ext2di6v1_3_04bindIJZNK4__87clEvE1cEEE);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::
  operator()<int,_const_boost::ext::di::v1_3_0::placeholders::arg_&,_double,_const_boost::ext::di::v1_3_0::placeholders::arg_&,_0>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_impl2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_2,_double>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_3,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_0,_0>
            (local_38);
  aVar1 = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i2,_impl2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<c,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_2,_double>,_boost::ext::di::v1_3_0::core::ctor_arg<c,_3,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>_>
          ::create<app,_0>(local_50);
  if ((aVar1.c_)->a != 0x2a) {
    expect_fail__((char *)local_58,local_60,0);
  }
  if (((aVar1.c_)->b != 87.0) || (NAN((aVar1.c_)->b))) {
    expect_fail__((char *)local_58,local_60,0);
  }
  peVar2 = std::__shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2> *)(aVar1.c_ + 1));
  if (peVar2 == (element_type *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = __dynamic_cast(peVar2,&i1::typeinfo,&impl1::typeinfo,0);
  }
  if (local_88 == 0) {
    expect_fail__((char *)local_58,local_60,0);
  }
  piVar3 = std::unique_ptr<i2,_std::default_delete<i2>_>::get(local_58);
  if (piVar3 == (pointer)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(piVar3,&i2::typeinfo,&impl2::typeinfo,0);
  }
  if (lVar4 == 0) {
    expect_fail__((char *)local_58,local_60,0);
  }
  return;
}

Assistant:

explicit c(...) {}